

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_to_bytes(uchar *buf,secp256k1_ge *a)

{
  secp256k1_ge *in_RDI;
  secp256k1_ge_storage *unaff_retaddr;
  secp256k1_ge_storage s;
  undefined1 local_50 [72];
  
  secp256k1_ge_to_storage(unaff_retaddr,in_RDI);
  memcpy(in_RDI,local_50,0x40);
  return;
}

Assistant:

static void secp256k1_ge_to_bytes(unsigned char *buf, const secp256k1_ge *a) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(a));
    secp256k1_ge_to_storage(&s, a);
    memcpy(buf, &s, 64);
}